

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aggregate_executor.hpp
# Opt level: O1

void duckdb::AggregateExecutor::
     UnaryUpdate<duckdb::SumState<duckdb::hugeint_t>,long,duckdb::SumToHugeintOperation>
               (Vector *input,AggregateInputData *aggr_input_data,data_ptr_t state,idx_t count)

{
  unsigned_long *puVar1;
  long *plVar2;
  data_ptr_t pdVar3;
  ulong uVar4;
  sel_t *psVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  idx_t iVar9;
  unsigned_long uVar10;
  ulong uVar11;
  idx_t iVar12;
  ulong uVar13;
  UnifiedVectorFormat idata;
  UnifiedVectorFormat local_70;
  
  if (input->vector_type == FLAT_VECTOR) {
    pdVar3 = input->data;
    FlatVector::VerifyFlatVector(input);
    if (0x3f < count + 0x3f) {
      puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      uVar8 = 0;
      uVar7 = 0;
      do {
        if (puVar1 == (unsigned_long *)0x0) {
          uVar10 = 0xffffffffffffffff;
        }
        else {
          uVar10 = puVar1[uVar8];
        }
        uVar13 = uVar7 + 0x40;
        if (count <= uVar7 + 0x40) {
          uVar13 = count;
        }
        uVar11 = uVar13;
        if (uVar10 != 0) {
          uVar11 = uVar7;
          if (uVar10 == 0xffffffffffffffff) {
            if (uVar7 < uVar13) {
              uVar11 = *(ulong *)(state + 8);
              do {
                uVar4 = *(ulong *)(pdVar3 + uVar7 * 8);
                uVar11 = uVar11 + uVar4;
                if (-1 < (long)uVar4 != uVar4 <= uVar11) {
                  *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + ((long)uVar4 >> 0x3f | 1U);
                }
                uVar7 = uVar7 + 1;
              } while (uVar13 != uVar7);
              *state = '\x01';
              *(ulong *)(state + 8) = uVar11;
              uVar11 = uVar7;
            }
          }
          else if (uVar7 < uVar13) {
            uVar11 = 0;
            do {
              if ((uVar10 >> (uVar11 & 0x3f) & 1) != 0) {
                *state = '\x01';
                uVar4 = *(ulong *)(pdVar3 + uVar11 * 8 + uVar7 * 8);
                lVar6 = *(long *)(state + 8);
                *(ulong *)(state + 8) = lVar6 + uVar4;
                if (-1 < (long)uVar4 != uVar4 <= lVar6 + uVar4) {
                  *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + ((long)uVar4 >> 0x3f | 1U);
                }
              }
              uVar11 = uVar11 + 1;
            } while ((uVar7 - uVar13) + uVar11 != 0);
            uVar11 = uVar7 + uVar11;
          }
        }
        uVar8 = uVar8 + 1;
        uVar7 = uVar11;
      } while (uVar8 != count + 0x3f >> 6);
    }
  }
  else if (input->vector_type == CONSTANT_VECTOR) {
    puVar1 = (input->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
    if ((puVar1 == (unsigned_long *)0x0) || ((*puVar1 & 1) != 0)) {
      plVar2 = (long *)input->data;
      *state = '\x01';
      AddToHugeint::AddConstant<duckdb::SumState<duckdb::hugeint_t>,long>
                ((SumState<duckdb::hugeint_t> *)state,*plVar2,count);
      return;
    }
  }
  else {
    UnifiedVectorFormat::UnifiedVectorFormat(&local_70);
    Vector::ToUnifiedFormat(input,count,&local_70);
    if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask ==
        (unsigned_long *)0x0) {
      if (count != 0) {
        psVar5 = (local_70.sel)->sel_vector;
        uVar7 = *(ulong *)(state + 8);
        iVar9 = 0;
        do {
          iVar12 = iVar9;
          if (psVar5 != (sel_t *)0x0) {
            iVar12 = (idx_t)psVar5[iVar9];
          }
          uVar8 = *(ulong *)(local_70.data + iVar12 * 8);
          uVar7 = uVar7 + uVar8;
          if (-1 < (long)uVar8 != uVar8 <= uVar7) {
            *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + ((long)uVar8 >> 0x3f | 1U);
          }
          iVar9 = iVar9 + 1;
        } while (count != iVar9);
        *state = '\x01';
        *(ulong *)(state + 8) = uVar7;
      }
    }
    else if (count != 0) {
      psVar5 = (local_70.sel)->sel_vector;
      iVar9 = 0;
      do {
        iVar12 = iVar9;
        if (psVar5 != (sel_t *)0x0) {
          iVar12 = (idx_t)psVar5[iVar9];
        }
        if ((local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask[iVar12 >> 6]
             >> (iVar12 & 0x3f) & 1) != 0) {
          *state = '\x01';
          uVar7 = *(ulong *)(local_70.data + iVar12 * 8);
          lVar6 = *(long *)(state + 8);
          *(ulong *)(state + 8) = lVar6 + uVar7;
          if (-1 < (long)uVar7 != uVar7 <= lVar6 + uVar7) {
            *(ulong *)(state + 0x10) = *(long *)(state + 0x10) + ((long)uVar7 >> 0x3f | 1U);
          }
        }
        iVar9 = iVar9 + 1;
      } while (count != iVar9);
    }
    if (local_70.owned_sel.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.owned_sel.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_70.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
  }
  return;
}

Assistant:

static void UnaryUpdate(Vector &input, AggregateInputData &aggr_input_data, data_ptr_t state, idx_t count) {
		switch (input.GetVectorType()) {
		case VectorType::CONSTANT_VECTOR: {
			if (OP::IgnoreNull() && ConstantVector::IsNull(input)) {
				return;
			}
			auto idata = ConstantVector::GetData<INPUT_TYPE>(input);
			AggregateUnaryInput input_data(aggr_input_data, ConstantVector::Validity(input));
			OP::template ConstantOperation<INPUT_TYPE, STATE_TYPE, OP>(*reinterpret_cast<STATE_TYPE *>(state), *idata,
			                                                           input_data, count);
			break;
		}
#ifndef DUCKDB_SMALLER_BINARY
		case VectorType::FLAT_VECTOR: {
			auto idata = FlatVector::GetData<INPUT_TYPE>(input);
			UnaryFlatUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(idata, aggr_input_data, (STATE_TYPE *)state, count,
			                                                FlatVector::Validity(input));
			break;
		}
#endif
		default: {
			UnifiedVectorFormat idata;
			input.ToUnifiedFormat(count, idata);
			UnaryUpdateLoop<STATE_TYPE, INPUT_TYPE, OP>(UnifiedVectorFormat::GetData<INPUT_TYPE>(idata),
			                                            aggr_input_data, (STATE_TYPE *)state, count, idata.validity,
			                                            *idata.sel);
			break;
		}
		}
	}